

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int ucstricmp(qsizetype alen,char16_t *a,qsizetype blen,char *b)

{
  long lVar1;
  char16_t cVar2;
  char16_t cVar3;
  longlong *plVar4;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  int diff;
  qsizetype i;
  qsizetype l;
  long local_40;
  int local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RDX;
  local_10 = in_RDI;
  plVar4 = qMin<long_long>(&local_10,&local_18);
  lVar1 = *plVar4;
  for (local_40 = 0; local_40 < lVar1; local_40 = local_40 + 1) {
    cVar2 = foldCase(L'\0');
    cVar3 = foldCase(L'\0');
    local_1c = (uint)(ushort)cVar2 - (uint)(ushort)cVar3;
    if (local_1c != 0) goto LAB_00155828;
  }
  if (local_40 == local_10) {
    if (local_40 == local_18) {
      local_1c = 0;
    }
    else {
      local_1c = -1;
    }
  }
  else {
    local_1c = 1;
  }
LAB_00155828:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp(qsizetype alen, const char16_t *a, qsizetype blen, const char *b)
{
    qsizetype l = qMin(alen, blen);
    qsizetype i;
    for (i = 0; i < l; ++i) {
        int diff = foldCase(a[i]) - foldCase(char16_t{uchar(b[i])});
        if ((diff))
            return diff;
    }
    if (i == alen) {
        if (i == blen)
            return 0;
        return -1;
    }
    return 1;
}